

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim.c
# Opt level: O0

Pdr_Set_t * Pdr_ManTernarySim(Pdr_Man_t *p,int k,Pdr_Set_t *pCube)

{
  Vec_Int_t *p_00;
  Vec_Int_t *vPiLits_00;
  Vec_Int_t *vCiObjs_00;
  Vec_Int_t *p_01;
  Vec_Int_t *vValues;
  Vec_Int_t *vValues_00;
  Vec_Int_t *vNodes_00;
  Vec_Int_t *p_02;
  Vec_Int_t *vVis;
  Vec_Int_t *p_03;
  Vec_Int_t *vRes_00;
  Aig_Man_t *pAVar1;
  FILE *pFile;
  int iVar2;
  int iVar3;
  abctime aVar4;
  Aig_Obj_t *pAVar5;
  abctime aVar6;
  Pdr_Set_t *pCube_00;
  abctime clk;
  int RetValue;
  int Entry;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vRes;
  Vec_Int_t *vCi2Rem;
  Vec_Int_t *vVisits;
  Vec_Int_t *vUndo;
  Vec_Int_t *vNodes;
  Vec_Int_t *vCoVals;
  Vec_Int_t *vCiVals;
  Vec_Int_t *vCoObjs;
  Vec_Int_t *vCiObjs;
  Vec_Int_t *vPiLits;
  Vec_Int_t *vPrio;
  Pdr_Set_t *pRes;
  Pdr_Set_t *pCube_local;
  int k_local;
  Pdr_Man_t *p_local;
  
  p_00 = p->vPrio;
  vPiLits_00 = p->vLits;
  vCiObjs_00 = p->vCiObjs;
  p_01 = p->vCoObjs;
  vValues = p->vCiVals;
  vValues_00 = p->vCoVals;
  vNodes_00 = p->vNodes;
  p_02 = p->vUndo;
  vVis = p->vVisits;
  p_03 = p->vCi2Rem;
  vRes_00 = p->vRes;
  aVar4 = Abc_Clock();
  Vec_IntClear(p_01);
  if (pCube == (Pdr_Set_t *)0x0) {
    pAVar5 = Aig_ManCo(p->pAig,p->iOutCur);
    iVar2 = Aig_ObjId(pAVar5);
    Vec_IntPush(p_01,iVar2);
  }
  else {
    for (RetValue = 0; RetValue < pCube->nLits; RetValue = RetValue + 1) {
      if (*(int *)(&pCube->field_0x14 + (long)RetValue * 4) != -1) {
        pAVar5 = Saig_ManLi(p->pAig,*(int *)(&pCube->field_0x14 + (long)RetValue * 4) >> 1);
        iVar2 = Aig_ObjId(pAVar5);
        Vec_IntPush(p_01,iVar2);
      }
    }
  }
  if (p->pPars->fVeryVerbose != 0) {
    Abc_Print(1,"Trying to justify cube ");
    pFile = _stdout;
    if (pCube == (Pdr_Set_t *)0x0) {
      Abc_Print(1,"<prop=fail>");
    }
    else {
      iVar2 = Aig_ManRegNum(p->pAig);
      Pdr_SetPrint(pFile,pCube,iVar2,(Vec_Int_t *)0x0);
    }
    Abc_Print(1," in frame %d.\n",(ulong)(uint)k);
  }
  Pdr_ManCollectCone(p->pAig,p_01,vCiObjs_00,vNodes_00);
  Pdr_ManCollectValues(p,k,vCiObjs_00,vValues);
  Pdr_ManCollectValues(p,k,p_01,vValues_00);
  if (p->pPars->fVeryVerbose != 0) {
    Pdr_ManPrintCex(p->pAig,vCiObjs_00,vValues,(Vec_Int_t *)0x0);
  }
  iVar2 = Pdr_ManSimDataInit(p->pAig,vCiObjs_00,vValues,vNodes_00,p_01,vValues_00,(Vec_Int_t *)0x0);
  if (iVar2 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrTsim.c"
                  ,0x195,"Pdr_Set_t *Pdr_ManTernarySim(Pdr_Man_t *, int, Pdr_Set_t *)");
  }
  Vec_IntClear(p_03);
  for (RetValue = 0; iVar2 = Vec_IntSize(vCiObjs_00), RetValue < iVar2; RetValue = RetValue + 1) {
    pAVar1 = p->pAig;
    iVar2 = Vec_IntEntry(vCiObjs_00,RetValue);
    pAVar5 = Aig_ManObj(pAVar1,iVar2);
    iVar2 = Saig_ObjIsLo(p->pAig,pAVar5);
    if (iVar2 != 0) {
      iVar2 = Aig_ObjCioId(pAVar5);
      iVar3 = Saig_ManPiNum(p->pAig);
      if ((p_00 == (Vec_Int_t *)0x0) || (iVar2 = Vec_IntEntry(p_00,iVar2 - iVar3), iVar2 == 0)) {
        Vec_IntClear(p_02);
        iVar2 = Pdr_ManExtendOne(p->pAig,pAVar5,p_02,vVis);
        if (iVar2 == 0) {
          Pdr_ManExtendUndo(p->pAig,p_02);
        }
        else {
          iVar2 = Aig_ObjId(pAVar5);
          Vec_IntPush(p_03,iVar2);
        }
      }
    }
  }
  for (RetValue = 0; iVar2 = Vec_IntSize(vCiObjs_00), RetValue < iVar2; RetValue = RetValue + 1) {
    pAVar1 = p->pAig;
    iVar2 = Vec_IntEntry(vCiObjs_00,RetValue);
    pAVar5 = Aig_ManObj(pAVar1,iVar2);
    iVar2 = Saig_ObjIsLo(p->pAig,pAVar5);
    if (iVar2 != 0) {
      iVar2 = Aig_ObjCioId(pAVar5);
      iVar3 = Saig_ManPiNum(p->pAig);
      if ((p_00 != (Vec_Int_t *)0x0) && (iVar2 = Vec_IntEntry(p_00,iVar2 - iVar3), iVar2 != 0)) {
        Vec_IntClear(p_02);
        iVar2 = Pdr_ManExtendOne(p->pAig,pAVar5,p_02,vVis);
        if (iVar2 == 0) {
          Pdr_ManExtendUndo(p->pAig,p_02);
        }
        else {
          iVar2 = Aig_ObjId(pAVar5);
          Vec_IntPush(p_03,iVar2);
        }
      }
    }
  }
  if (p->pPars->fVeryVerbose != 0) {
    Pdr_ManPrintCex(p->pAig,vCiObjs_00,vValues,p_03);
  }
  iVar2 = Pdr_ManSimDataInit(p->pAig,vCiObjs_00,vValues,vNodes_00,p_01,vValues_00,p_03);
  if (iVar2 != 0) {
    Pdr_ManDeriveResult(p->pAig,vCiObjs_00,vValues,p_03,vRes_00,vPiLits_00);
    iVar2 = Vec_IntSize(vRes_00);
    if (iVar2 < 1) {
      __assert_fail("Vec_IntSize(vRes) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrTsim.c"
                    ,0x1dc,"Pdr_Set_t *Pdr_ManTernarySim(Pdr_Man_t *, int, Pdr_Set_t *)");
    }
    aVar6 = Abc_Clock();
    p->tTsim = (aVar6 - aVar4) + p->tTsim;
    pCube_00 = Pdr_SetCreate(vRes_00,vPiLits_00);
    if ((k != 0) && (iVar2 = Pdr_SetIsInit(pCube_00,-1), iVar2 != 0)) {
      __assert_fail("k == 0 || !Pdr_SetIsInit(pRes, -1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrTsim.c"
                    ,0x1df,"Pdr_Set_t *Pdr_ManTernarySim(Pdr_Man_t *, int, Pdr_Set_t *)");
    }
    return pCube_00;
  }
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrTsim.c"
                ,0x1d8,"Pdr_Set_t *Pdr_ManTernarySim(Pdr_Man_t *, int, Pdr_Set_t *)");
}

Assistant:

Pdr_Set_t * Pdr_ManTernarySim( Pdr_Man_t * p, int k, Pdr_Set_t * pCube )
{
    Pdr_Set_t * pRes;
    Vec_Int_t * vPrio   = p->vPrio;    // priority flops (flop indices)
    Vec_Int_t * vPiLits = p->vLits;    // array of literals (0/1 PI values)
    Vec_Int_t * vCiObjs = p->vCiObjs;  // cone leaves (CI obj IDs)
    Vec_Int_t * vCoObjs = p->vCoObjs;  // cone roots (CO obj IDs)
    Vec_Int_t * vCiVals = p->vCiVals;  // cone leaf values (0/1 CI values)
    Vec_Int_t * vCoVals = p->vCoVals;  // cone root values (0/1 CO values)
    Vec_Int_t * vNodes  = p->vNodes;   // cone nodes (node obj IDs)
    Vec_Int_t * vUndo   = p->vUndo;    // cone undos (node obj IDs)
    Vec_Int_t * vVisits = p->vVisits;  // intermediate (obj IDs)
    Vec_Int_t * vCi2Rem = p->vCi2Rem;  // CIs to be removed (CI obj IDs)
    Vec_Int_t * vRes    = p->vRes;     // final result (flop literals)
    Aig_Obj_t * pObj;
    int i, Entry, RetValue;
    abctime clk = Abc_Clock();

    // collect CO objects
    Vec_IntClear( vCoObjs );
    if ( pCube == NULL ) // the target is the property output
    {
//        Vec_IntPush( vCoObjs, Aig_ObjId(Aig_ManCo(p->pAig, (p->pPars->iOutput==-1)?0:p->pPars->iOutput)) );
        Vec_IntPush( vCoObjs, Aig_ObjId(Aig_ManCo(p->pAig, p->iOutCur)) );
    }
    else // the target is the cube
    {
        for ( i = 0; i < pCube->nLits; i++ )
        {
            if ( pCube->Lits[i] == -1 )
                continue;
            pObj = Saig_ManLi(p->pAig, (pCube->Lits[i] >> 1));
            Vec_IntPush( vCoObjs, Aig_ObjId(pObj) );
        }
    }
if ( p->pPars->fVeryVerbose )
{
Abc_Print( 1, "Trying to justify cube " );
if ( pCube )
    Pdr_SetPrint( stdout, pCube, Aig_ManRegNum(p->pAig), NULL );
else
    Abc_Print( 1, "<prop=fail>" );
Abc_Print( 1, " in frame %d.\n", k );
}

    // collect CI objects
    Pdr_ManCollectCone( p->pAig, vCoObjs, vCiObjs, vNodes );
    // collect values
    Pdr_ManCollectValues( p, k, vCiObjs, vCiVals );
    Pdr_ManCollectValues( p, k, vCoObjs, vCoVals );
    // simulate for the first time
if ( p->pPars->fVeryVerbose )
Pdr_ManPrintCex( p->pAig, vCiObjs, vCiVals, NULL );
    RetValue = Pdr_ManSimDataInit( p->pAig, vCiObjs, vCiVals, vNodes, vCoObjs, vCoVals, NULL );
    assert( RetValue );

#if 1
    // try removing high-priority flops
    Vec_IntClear( vCi2Rem );
    Aig_ManForEachObjVec( vCiObjs, p->pAig, pObj, i )
    {
        if ( !Saig_ObjIsLo( p->pAig, pObj ) )
            continue;
        Entry = Aig_ObjCioId(pObj) - Saig_ManPiNum(p->pAig);
        if ( vPrio != NULL && Vec_IntEntry( vPrio, Entry ) != 0 )
            continue;
        Vec_IntClear( vUndo );
        if ( Pdr_ManExtendOne( p->pAig, pObj, vUndo, vVisits ) )
            Vec_IntPush( vCi2Rem, Aig_ObjId(pObj) );
        else
            Pdr_ManExtendUndo( p->pAig, vUndo );
    }
    // try removing low-priority flops
    Aig_ManForEachObjVec( vCiObjs, p->pAig, pObj, i )
    {
        if ( !Saig_ObjIsLo( p->pAig, pObj ) )
            continue;
        Entry = Aig_ObjCioId(pObj) - Saig_ManPiNum(p->pAig);
        if ( vPrio == NULL || Vec_IntEntry( vPrio, Entry ) == 0 )
            continue;
        Vec_IntClear( vUndo );
        if ( Pdr_ManExtendOne( p->pAig, pObj, vUndo, vVisits ) )
            Vec_IntPush( vCi2Rem, Aig_ObjId(pObj) );
        else
            Pdr_ManExtendUndo( p->pAig, vUndo );
    }
#else
    // try removing low-priority flops
    Aig_ManForEachObjVec( vCiObjs, p->pAig, pObj, i )
    {
        if ( !Saig_ObjIsLo( p->pAig, pObj ) )
            continue;
        Entry = Aig_ObjCioId(pObj) - Saig_ManPiNum(p->pAig);
        if ( vPrio == NULL || Vec_IntEntry( vPrio, Entry ) == 0 )
            continue;
        Vec_IntClear( vUndo );
        if ( Pdr_ManExtendOne( p->pAig, pObj, vUndo, vVisits ) )
            Vec_IntPush( vCi2Rem, Aig_ObjId(pObj) );
        else
            Pdr_ManExtendUndo( p->pAig, vUndo );
    }
    // try removing high-priority flops
    Vec_IntClear( vCi2Rem );
    Aig_ManForEachObjVec( vCiObjs, p->pAig, pObj, i )
    {
        if ( !Saig_ObjIsLo( p->pAig, pObj ) )
            continue;
        Entry = Aig_ObjCioId(pObj) - Saig_ManPiNum(p->pAig);
        if ( vPrio != NULL && Vec_IntEntry( vPrio, Entry ) != 0 )
            continue;
        Vec_IntClear( vUndo );
        if ( Pdr_ManExtendOne( p->pAig, pObj, vUndo, vVisits ) )
            Vec_IntPush( vCi2Rem, Aig_ObjId(pObj) );
        else
            Pdr_ManExtendUndo( p->pAig, vUndo );
    }
#endif

if ( p->pPars->fVeryVerbose )
Pdr_ManPrintCex( p->pAig, vCiObjs, vCiVals, vCi2Rem );
    RetValue = Pdr_ManSimDataInit( p->pAig, vCiObjs, vCiVals, vNodes, vCoObjs, vCoVals, vCi2Rem );
    assert( RetValue );

    // derive the set of resulting registers
    Pdr_ManDeriveResult( p->pAig, vCiObjs, vCiVals, vCi2Rem, vRes, vPiLits );
    assert( Vec_IntSize(vRes) > 0 );
    p->tTsim += Abc_Clock() - clk;
    pRes = Pdr_SetCreate( vRes, vPiLits );
    assert( k == 0 || !Pdr_SetIsInit(pRes, -1) );
    return pRes;
}